

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>_>
 __thiscall testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>_>
  PVar1;
  _Vector_base<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>,_std::allocator<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>_>_>
  _Stack_28;
  
  ValueArray<libaom_test::FuncParam<unsigned_long(*)(short_const*,short_const*,unsigned_char_const*,int)>>
  ::
  MakeVector<libaom_test::FuncParam<unsigned_long(*)(short_const*,short_const*,unsigned_char_const*,int)>,0ul>
            (&_Stack_28);
  ValuesIn<std::vector<libaom_test::FuncParam<unsigned_long(*)(short_const*,short_const*,unsigned_char_const*,int)>,std::allocator<libaom_test::FuncParam<unsigned_long(*)(short_const*,short_const*,unsigned_char_const*,int)>>>>
            ((testing *)this,
             (vector<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>,_std::allocator<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>_>_>
              *)&_Stack_28);
  std::
  _Vector_base<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>,_std::allocator<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>_>_>
  ::~_Vector_base(&_Stack_28);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_const_short_*,_const_unsigned_char_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }